

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

void __thiscall Js::RegSlotVariablesWalker::PopulateMembers(RegSlotVariablesWalker *this)

{
  DebuggerScope *this_00;
  DiagStackFrame *pDVar1;
  code *pcVar2;
  RegSlot location;
  PropertyId propertyId_00;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  FunctionBody *this_01;
  undefined4 extraout_var_00;
  PropertyIdOnRegSlotsContainer *this_02;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DebuggerPropertyDisplayInfo *pDVar8;
  uint index;
  undefined4 *puVar9;
  undefined1 local_64 [8];
  DebuggerScopeProperty debuggerScopeProperty;
  DebuggerScope *local_48;
  RegSlot local_3c;
  PropertyId local_38;
  RegSlot reg;
  PropertyId propertyId;
  bool isConst;
  bool isInDeadZone;
  
  if ((this->super_VariableWalkerBase).pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    iVar5 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[2])();
    this_01 = JavascriptFunction::GetFunctionBody
                        ((JavascriptFunction *)CONCAT44(extraout_var,iVar5));
    iVar5 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[0xe])();
    this_02 = (PropertyIdOnRegSlotsContainer *)
              FunctionProxy::GetAuxPtr((FunctionProxy *)this_01,PropertyIdOnRegSlotsContainer);
    if (((this->super_VariableWalkerBase).groupType & ~UIGroupType_Param) == UIGroupType_None) {
      local_48 = LocalsWalker::GetScopeWhenHaltAtFormals((this->super_VariableWalkerBase).pFrame);
    }
    else {
      local_48 = (DebuggerScope *)0x0;
    }
    if (this_02 != (PropertyIdOnRegSlotsContainer *)0x0) {
      if (this_02->formalsUpperBound == 0xffffffff) {
        debuggerScopeProperty.byteCodeInitializationOffset = -1;
      }
      else {
        debuggerScopeProperty.byteCodeInitializationOffset =
             FunctionBody::MapRegSlot(this_01,this_02->formalsUpperBound);
      }
      pLVar7 = (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)new<Memory::ArenaAllocator>
                            (0x30,(ArenaAllocator *)CONCAT44(extraout_var_00,iVar5),0x364470);
      (pLVar7->
      super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
      ).alloc = (ArenaAllocator *)CONCAT44(extraout_var_00,iVar5);
      (pLVar7->
      super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
      )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e4370;
      (pLVar7->
      super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
      ).buffer = (Type)0x0;
      (pLVar7->
      super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
      ).count = 0;
      pLVar7->length = 0;
      pLVar7->increment = 4;
      (this->super_VariableWalkerBase).pMembersList = pLVar7;
      if (this_02->length != 0) {
        register0x00000000 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        index = 0;
        do {
          PropertyIdOnRegSlotsContainer::FetchItemAt(this_02,index,this_01,&local_38,&local_3c);
          propertyId_00 = local_38;
          location = local_3c;
          reg._2_1_ = 0;
          reg._3_1_ = 0;
          this_00 = this->debuggerScope;
          if (this_00 == (DebuggerScope *)0x0) {
            local_64._0_4_ = local_64._0_4_ & 0xffffff00;
            bVar4 = VariableWalkerBase::IsPropertyValid
                              (&this->super_VariableWalkerBase,local_38,local_3c,(bool *)local_64,
                               (bool *)((long)&reg + 2),(bool *)((long)&reg + 3));
            bVar3 = local_64[0] ^ 1;
            if (!bVar4) {
              bVar3 = 0;
            }
          }
          else {
            iVar5 = LocalsWalker::GetAdjustedByteCodeOffset((this->super_VariableWalkerBase).pFrame)
            ;
            bVar3 = DebuggerScope::TryGetValidProperty
                              (this_00,propertyId_00,location,iVar5,
                               (DebuggerScopeProperty *)local_64,(bool *)((long)&reg + 3));
            if ((bool)bVar3) {
              reg._2_1_ = (byte)debuggerScopeProperty.location & 1;
            }
          }
          puVar9 = stack0xffffffffffffffb0;
          if ((bVar3 & 1) != 0) {
            if ((local_48 == (DebuggerScope *)0x0) ||
               (iVar5 = (local_48->range).end,
               iVar6 = LocalsWalker::GetAdjustedByteCodeOffset
                                 ((this->super_VariableWalkerBase).pFrame),
               puVar9 = stack0xffffffffffffffb0, iVar5 <= iVar6)) {
              puVar9 = stack0xffffffffffffffb0;
              if (((this_01->field_0x17b & 4) == 0) &&
                 (bVar4 = DebuggerScope::HasProperty(local_48,local_38), bVar4)) {
                debuggerScopeProperty.location = 0;
                local_64._0_4_ = 0;
                DebuggerScope::TryGetProperty
                          (local_48,local_38,local_3c,(DebuggerScopeProperty *)local_64);
                puVar9 = stack0xffffffffffffffb0;
                if ((debuggerScopeProperty.location & 0x16) != 0) {
                  bVar3 = 0;
                }
              }
            }
            else if (debuggerScopeProperty.byteCodeInitializationOffset == -1) {
              bVar3 = DebuggerScope::HasProperty(local_48,local_38);
            }
            else {
              bVar3 = local_3c <= (uint)debuggerScopeProperty.byteCodeInitializationOffset;
            }
          }
          if ((bVar3 & 1) != 0) {
            pDVar1 = (this->super_VariableWalkerBase).pFrame;
            iVar5 = (*pDVar1->_vptr_DiagStackFrame[5])(pDVar1,(ulong)local_3c,0);
            if ((CONCAT44(extraout_var_01,iVar5) != 0) || (local_38 != 0x1cf)) {
              iVar6 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])();
              if (*(long *)(*(long *)(CONCAT44(extraout_var_02,iVar6) + 8) + 0x4f8) ==
                  CONCAT44(extraout_var_01,iVar5)) {
                reg._3_1_ = 1;
              }
              pDVar8 = VariableWalkerBase::AllocateNewPropertyDisplayInfo
                                 (&this->super_VariableWalkerBase,local_38,(Var)(ulong)local_3c,
                                  (bool)reg._2_1_,(bool)(reg._3_1_ & 1));
              if (pDVar8 == (DebuggerPropertyDisplayInfo *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar9 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                            ,0x2fb,"(info != nullptr)","info != nullptr");
                if (!bVar4) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                *puVar9 = 0;
              }
              pLVar7 = (this->super_VariableWalkerBase).pMembersList;
              JsUtil::
              List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::EnsureArray(pLVar7,0);
              iVar5 = (pLVar7->
                      super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                      ).count;
              (pLVar7->
              super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
              ).buffer[iVar5] = pDVar8;
              (pLVar7->
              super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
              ).count = iVar5 + 1;
            }
          }
          index = index + 1;
        } while (index < this_02->length);
      }
    }
  }
  return;
}

Assistant:

void RegSlotVariablesWalker::PopulateMembers()
    {
        if (pMembersList == nullptr)
        {
            Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();
            ArenaAllocator *arena = pFrame->GetArena();

            PropertyIdOnRegSlotsContainer *propIdContainer = pFBody->GetPropertyIdOnRegSlotsContainer();

            DebuggerScope *formalScope = GetScopeWhenHaltAtFormals();

            // this container can be nullptr if there is no locals in current function.
            if (propIdContainer != nullptr)
            {
                RegSlot limit = propIdContainer->formalsUpperBound == Js::Constants::NoRegister ? Js::Constants::NoRegister : pFBody->MapRegSlot(propIdContainer->formalsUpperBound);

                pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(arena);
                for (uint i = 0; i < propIdContainer->length; i++)
                {
                    Js::PropertyId propertyId;
                    RegSlot reg;
                    propIdContainer->FetchItemAt(i, pFBody, &propertyId, &reg);
                    bool shouldInsert = false;
                    bool isConst = false;
                    bool isInDeadZone = false;

                    if (this->debuggerScope)
                    {
                        DebuggerScopeProperty debuggerScopeProperty;
                        if (this->debuggerScope->TryGetValidProperty(propertyId, reg, GetAdjustedByteCodeOffset(), &debuggerScopeProperty, &isInDeadZone))
                        {
                            isConst = debuggerScopeProperty.IsConst();
                            shouldInsert = true;
                        }
                    }
                    else
                    {
                        bool isPropertyInDebuggerScope = false;
                        shouldInsert = IsPropertyValid(propertyId, reg, &isPropertyInDebuggerScope, &isConst, &isInDeadZone) && !isPropertyInDebuggerScope;
                    }

                    if (shouldInsert)
                    {
                        if (IsInParamScope(formalScope, pFrame))
                        {
                            if (limit != Js::Constants::NoRegister)
                            {
                                shouldInsert = reg <= limit;
                            }
                            else
                            {
                                shouldInsert = formalScope->HasProperty(propertyId);
                            }
                        }
                        else if (!pFBody->IsParamAndBodyScopeMerged() && formalScope->HasProperty(propertyId))
                        {
                            DebuggerScopeProperty prop;
                            prop.flags = DebuggerScopePropertyFlags_None;
                            prop.propId = 0;
                            formalScope->TryGetProperty(propertyId, reg, &prop);
                            if (prop.flags & DebuggerScopePropertyFlags_HasDuplicateInBody)
                            {
                                shouldInsert = false;
                            }
                        }
                    }

                    if (shouldInsert)
                    {
                        Var value = pFrame->GetRegValue(reg);

                        // If the user didn't supply an arguments object, a fake one will
                        // be created when evaluating LocalsWalker::ShouldInsertFakeArguments().
                        if (!(propertyId == PropertyIds::arguments && value == nullptr))
                        {
                            if (pFrame->GetScriptContext()->IsUndeclBlockVar(value))
                            {
                                isInDeadZone = true;
                            }

                            DebuggerPropertyDisplayInfo *info = AllocateNewPropertyDisplayInfo(
                                propertyId,
                                (Var)reg,
                                isConst,
                                isInDeadZone);

                            Assert(info != nullptr);
                            pMembersList->Add(info);
                        }
                    }
                }
            }
        }
    }